

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O1

void __thiscall
Lib::
Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
::Recycled(Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
           *this)

{
  unique_ptr<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_>_>
  *puVar1;
  default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_> *this_00;
  Stack<std::unique_ptr<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_>_>_>
  *pSVar2;
  _Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_*,_false> _Var3;
  pointer *__ptr;
  
  pSVar2 = mem();
  if (pSVar2->_cursor == pSVar2->_stack) {
    _Var3._M_head_impl =
         (Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_> *)
         FixedSizeAllocator<32UL>::alloc
                   ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    (_Var3._M_head_impl)->_capacity = 0;
    (_Var3._M_head_impl)->_stack = (BottomUpChildIter<Kernel::AutoDerefTermSpec> *)0x0;
    (_Var3._M_head_impl)->_cursor = (BottomUpChildIter<Kernel::AutoDerefTermSpec> *)0x0;
    (_Var3._M_head_impl)->_end = (BottomUpChildIter<Kernel::AutoDerefTermSpec> *)0x0;
    (this->_self)._M_t.
    super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_>_>
    .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_*,_false>.
    _M_head_impl = _Var3._M_head_impl;
  }
  else {
    pSVar2 = mem();
    puVar1 = pSVar2->_cursor;
    pSVar2->_cursor = puVar1 + -1;
    (this->_self)._M_t.
    super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_>_>
    .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_*,_false>.
    _M_head_impl = puVar1[-1]._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_>_>
                   .
                   super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_*,_false>
                   ._M_head_impl;
    puVar1[-1]._M_t.
    super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_>_>
    .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_*,_false>.
    _M_head_impl = (Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_> *)0x0;
    this_00 = (default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_> *)
              pSVar2->_cursor;
    if (*(Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_> **)this_00 !=
        (Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_> *)0x0) {
      std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_>::
      operator()(this_00,*(Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_> **)this_00);
    }
    *(undefined8 *)this_00 = 0;
  }
  return;
}

Assistant:

Recycled()
    : _self(mem().isNonEmpty() ? mem().pop() : IF_USE_PTRS(std::make_unique<T>(), T()))
  { }